

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O2

void __thiscall QCompleter::setModel(QCompleter *this,QAbstractItemModel *model)

{
  long lVar1;
  long *plVar2;
  QAbstractItemView *popup;
  QObject *object;
  QFileSystemModel *pQVar3;
  long in_FS_OFFSET;
  QObject local_30 [8];
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&this->field_0x8;
  object = (QObject *)QAbstractProxyModel::sourceModel();
  if (object != (QObject *)model) {
    pQVar3 = QtPrivate::qobject_cast_helper<QFileSystemModel_const*,QObject>(object);
    if (pQVar3 != (QFileSystemModel *)0x0) {
      setCompletionRole(this,2);
    }
    plVar2 = *(long **)(lVar1 + 0x88);
    (**(code **)(*plVar2 + 0x188))(plVar2,model);
    popup = *(QAbstractItemView **)(lVar1 + 0x90);
    if (popup != (QAbstractItemView *)0x0) {
      setPopup(this,popup);
    }
    if ((object != (QObject *)0x0) && (*(QCompleter **)(*(long *)(object + 8) + 0x10) == this)) {
      (**(code **)(*(long *)object + 0x20))(object);
    }
    pQVar3 = QtPrivate::qobject_cast_helper<QFileSystemModel*,QObject>((QObject *)model);
    if (pQVar3 != (QFileSystemModel *)0x0) {
      setCaseSensitivity(this,CaseSensitive);
      setCompletionRole(this,0x102);
      QObject::connect(local_30,(char *)pQVar3,(QObject *)"2directoryLoaded(QString)",(char *)this,
                       0x67ce2e);
      QMetaObject::Connection::~Connection((Connection *)local_30);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QCompleter::setModel(QAbstractItemModel *model)
{
    Q_D(QCompleter);
    QAbstractItemModel *oldModel = d->proxy->sourceModel();
    if (oldModel == model)
        return;
#if QT_CONFIG(filesystemmodel)
    if (qobject_cast<const QFileSystemModel *>(oldModel))
        setCompletionRole(Qt::EditRole); // QTBUG-54642, clear FileNameRole set by QFileSystemModel
#endif
    d->proxy->setSourceModel(model);
    if (d->popup)
        setPopup(d->popup); // set the model and make new connections
    if (oldModel && oldModel->QObject::parent() == this)
        delete oldModel;
#if QT_CONFIG(filesystemmodel)
    QFileSystemModel *fsModel = qobject_cast<QFileSystemModel *>(model);
    if (fsModel) {
#if defined(Q_OS_WIN)
        setCaseSensitivity(Qt::CaseInsensitive);
#else
        setCaseSensitivity(Qt::CaseSensitive);
#endif
        setCompletionRole(QFileSystemModel::FileNameRole);
        connect(fsModel, SIGNAL(directoryLoaded(QString)), this, SLOT(_q_fileSystemModelDirectoryLoaded(QString)));
    }
#endif // QT_CONFIG(filesystemmodel)
}